

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkTSDA::ArchiveOUT(ChLinkTSDA *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkTSDA>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_28._value = &this->m_rest_length;
  local_28._name = "m_rest_length";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChLinkTSDA::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkTSDA>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_rest_length);
}